

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionTest.cpp
# Opt level: O0

void __thiscall
AssertionTest_assertFalseHandlerShouldNotBeCalled_Test::TestBody
          (AssertionTest_assertFalseHandlerShouldNotBeCalled_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_b8;
  Message local_b0;
  int local_a4;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar;
  bool condition;
  AssertionTest_assertFalseHandlerShouldNotBeCalled_Test *this_local;
  
  local_a4 = 0;
  testing::internal::EqHelper<true>::Compare<int,int>
            ((char *)local_a0,"0",(int *)"assertionHandlerCounter_",&local_a4,
             &(this->super_AssertionTest).assertionHandlerCounter_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_a0);
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/DariuszOstolski[P]cppassert/tests/AssertionTest.cpp"
               ,0x5f,message);
    testing::internal::AssertHelper::operator=(&local_b8,&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    testing::Message::~Message(&local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  return;
}

Assistant:

TEST_F(AssertionTest, assertFalseHandlerShouldNotBeCalled)
{
    bool condition = false;
    CPP_ASSERT_FALSE(condition);
    EXPECT_EQ(0, assertionHandlerCounter_);
}